

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

int64_t soul::heart::getClockRatioFromValue<soul::CodeLocation&>
                  (CodeLocation *errorLocation,Value *value)

{
  Value *pVVar1;
  bool bVar2;
  Type *this;
  CompileMessage local_d8;
  CompileMessage local_a0;
  int64_t local_68;
  int64_t v;
  CompileMessage local_50;
  Value *local_18;
  Value *value_local;
  CodeLocation *errorLocation_local;
  
  local_18 = value;
  value_local = (Value *)errorLocation;
  this = soul::Value::getType(value);
  bVar2 = Type::isPrimitiveInteger(this);
  pVVar1 = value_local;
  if (!bVar2) {
    Errors::ratioMustBeInteger<>();
    CodeLocation::throwError((CodeLocation *)pVVar1,&local_50);
  }
  local_68 = soul::Value::getAsInt64(local_18);
  pVVar1 = value_local;
  if ((0 < local_68) && (local_68 < 0x201)) {
    bVar2 = choc::math::isPowerOf2<long>(local_68);
    pVVar1 = value_local;
    if (!bVar2) {
      Errors::ratioMustBePowerOf2<>();
      CodeLocation::throwError((CodeLocation *)pVVar1,&local_d8);
    }
    return local_68;
  }
  Errors::ratioOutOfRange<>();
  CodeLocation::throwError((CodeLocation *)pVVar1,&local_a0);
}

Assistant:

static int64_t getClockRatioFromValue (Thrower&& errorLocation, const Value& value)
    {
        if (! value.getType().isPrimitiveInteger())
            errorLocation.throwError (Errors::ratioMustBeInteger());

        auto v = value.getAsInt64();

        if (v < 1 || v > 512)
            errorLocation.throwError (Errors::ratioOutOfRange());

        if (! choc::math::isPowerOf2 (v))
            errorLocation.throwError (Errors::ratioMustBePowerOf2());

        return v;
    }